

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlGlyphClassDefn.cpp
# Opt level: O0

void __thiscall
GdlGlyphClassDefn::FlattenGlyphList
          (GdlGlyphClassDefn *this,
          vector<unsigned_short,_std::allocator<unsigned_short>_> *vgidFlattened)

{
  value_type_conflict2 *pvVar1;
  GdlGlyphClassDefn *in_RDI;
  size_t igid;
  value_type_conflict2 *__x;
  value_type_conflict2 *local_18;
  
  if ((in_RDI->m_fHasFlatList & 1U) == 0) {
    FlattenMyGlyphList(in_RDI);
  }
  local_18 = (value_type_conflict2 *)0x0;
  while( true ) {
    __x = local_18;
    pvVar1 = (value_type_conflict2 *)
             std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                       (&in_RDI->m_vgidFlattened);
    if (pvVar1 <= __x) break;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
              (&in_RDI->m_vgidFlattened,(size_type_conflict)local_18);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)in_RDI,__x);
    local_18 = (value_type_conflict2 *)((long)local_18 + 1);
  }
  return;
}

Assistant:

void GdlGlyphClassDefn::FlattenGlyphList(std::vector<utf16> & vgidFlattened)
{
	if (!m_fHasFlatList)
		FlattenMyGlyphList();
	for (size_t igid = 0; igid < m_vgidFlattened.size(); igid++)
	{
		vgidFlattened.push_back(m_vgidFlattened[igid]);
	}
}